

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::
     unserialize_unpack<char_const*const*,serialization::json_iarchive,std::__cxx11::string&,int&>
               (char ***arg,json_iarchive *ar,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *front,int *next)

{
  char *key;
  
  key = **arg;
  json_iarchive::load_key_start(ar,key);
  json_iarchive::load(ar,front);
  json_iarchive::load_key_end(ar,key);
  *arg = *arg + 1;
  unserialize_unpack<char_const*const*&,serialization::json_iarchive,int&>(arg,ar,next);
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, T && front, Args&& ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.load_key_start(key);
    unserialize_helper(ar, front);
    ar.load_key_end(key);

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}